

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O1

void __thiscall
wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>::
IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
          (IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
           *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *fallback,string *prefix)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  __hashtable *p_Var6;
  ulong __val;
  char cVar7;
  pointer pHVar8;
  undefined1 auVar9 [16];
  uintptr_t local_130;
  undefined1 local_128 [16];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_118;
  undefined1 local_e0 [16];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_98;
  string *local_90;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_88;
  IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>> *local_80
  ;
  size_type *local_78;
  string __str;
  __hashtable *__h;
  __buckets_ptr local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>> **)
   (this + 0x20) = this + 0x50;
  *(undefined8 *)(this + 0x28) = 1;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0x3f800000;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> **)(this + 0x58) = fallback;
  *(IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>> **)
   (this + 0x60) = this + 0x90;
  *(undefined8 *)(this + 0x68) = 1;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined4 *)(this + 0x80) = 0x3f800000;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  pHVar8 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar8) {
    local_80 = this + 0x20;
    __str.field_2._8_8_ = this + 0x60;
    __val = 0;
    local_90 = prefix;
    local_88 = types;
    do {
      cVar7 = '\x01';
      if (9 < __val) {
        uVar5 = __val;
        cVar3 = '\x04';
        do {
          cVar7 = cVar3;
          if (uVar5 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_001f4ed4;
          }
          if (uVar5 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_001f4ed4;
          }
          if (uVar5 < 10000) goto LAB_001f4ed4;
          bVar2 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar3 = cVar7 + '\x04';
        } while (bVar2);
        cVar7 = cVar7 + '\x01';
      }
LAB_001f4ed4:
      local_78 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78,(uint)__str._M_dataplus._M_p,__val);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_78,0,(char *)0x0,(ulong)(local_90->_M_dataplus)._M_p
                                 );
      __h = (__hashtable *)&local_40;
      p_Var6 = (__hashtable *)(plVar4 + 2);
      if ((__hashtable *)*plVar4 == p_Var6) {
        local_40 = p_Var6->_M_buckets;
        uStack_38 = (undefined4)plVar4[3];
        uStack_34 = *(undefined4 *)((long)plVar4 + 0x1c);
      }
      else {
        local_40 = p_Var6->_M_buckets;
        __h = (__hashtable *)*plVar4;
      }
      lVar1 = plVar4[1];
      *plVar4 = (long)p_Var6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      auVar9 = ::wasm::IString::interned(lVar1,__h,0);
      local_d0._M_buckets = &local_d0._M_single_bucket;
      local_d0._M_bucket_count = 1;
      local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d0._M_element_count = 0;
      local_d0._M_rehash_policy._M_max_load_factor = 1.0;
      local_d0._M_rehash_policy._4_4_ = 0;
      local_d0._M_rehash_policy._M_next_resize = 0;
      local_d0._M_single_bucket = (__node_base_ptr)0x0;
      local_130 = pHVar8[__val].id;
      local_118._M_buckets = (__buckets_ptr)0x0;
      local_118._M_bucket_count = 1;
      local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_118._M_element_count = 0;
      local_118._M_rehash_policy._M_max_load_factor = 1.0;
      local_118._M_rehash_policy._4_4_ = 0;
      local_118._M_rehash_policy._M_next_resize = 0;
      local_118._M_single_bucket = (__node_base_ptr)0x0;
      local_98._M_h = (__hashtable_alloc *)&local_118;
      local_128 = auVar9;
      local_e0 = auVar9;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_98._M_h,&local_d0,&local_98);
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)__str.field_2._8_8_,&local_130);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_118);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_d0);
      if (__h != (__hashtable *)&local_40) {
        operator_delete(__h,(long)local_40 + 1);
      }
      if (local_78 != &__str._M_string_length) {
        operator_delete(local_78,__str._M_string_length + 1);
      }
      __val = __val + 1;
      pHVar8 = (local_88->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (__val < (ulong)((long)(local_88->
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3))
    ;
  }
  return;
}

Assistant:

IndexedTypeNameGenerator(T& types,
                           FallbackGenerator& fallback,
                           const std::string& prefix = "")
    : fallback(fallback) {
    for (size_t i = 0; i < types.size(); ++i) {
      names.insert({types[i], {prefix + std::to_string(i), {}}});
    }
  }